

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

SRC_STATE * sinc_copy(SRC_STATE *state)

{
  void *__src;
  SRC_STATE *__ptr;
  SRC_STATE *pSVar1;
  void *__dest;
  long lVar2;
  SRC_STATE *pSVar3;
  size_t __size;
  byte bVar4;
  
  bVar4 = 0;
  if (state == (SRC_STATE *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                  ,0x14d,"SRC_STATE *sinc_copy(SRC_STATE *)");
  }
  __src = state->private_data;
  if ((__src != (void *)0x0) && (__ptr = (SRC_STATE *)calloc(1,0x50), __ptr != (SRC_STATE *)0x0)) {
    pSVar1 = state;
    pSVar3 = __ptr;
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pSVar3->vt = pSVar1->vt;
      pSVar1 = (SRC_STATE *)((long)pSVar1 + (ulong)bVar4 * -0x10 + 8);
      pSVar3 = (SRC_STATE *)((long)pSVar3 + (ulong)bVar4 * -0x10 + 8);
    }
    pSVar1 = (SRC_STATE *)calloc(1,0x860);
    if (pSVar1 != (SRC_STATE *)0x0) {
      memcpy(pSVar1,__src,0x860);
      __size = ((long)state->channels + (long)*(int *)((long)__src + 0x54)) * 4;
      __dest = malloc(__size);
      pSVar1[0x1a].saved_frames = (long)__dest;
      if (__dest != (void *)0x0) {
        memcpy(__dest,*(void **)((long)__src + 0x858),__size);
        __ptr->private_data = pSVar1;
        return __ptr;
      }
      free(__ptr);
      __ptr = pSVar1;
    }
    free(__ptr);
  }
  return (SRC_STATE *)0x0;
}

Assistant:

static SRC_STATE *
sinc_copy (SRC_STATE *state)
{
	assert (state != NULL) ;

	if (state->private_data == NULL)
		return NULL ;

	SRC_STATE *to = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!to)
		return NULL ;
	memcpy (to, state, sizeof (SRC_STATE)) ;


	SINC_FILTER* from_filter = (SINC_FILTER*) state->private_data ;
	SINC_FILTER *to_filter = (SINC_FILTER *) calloc (1, sizeof (SINC_FILTER)) ;
	if (!to_filter)
	{
		free (to) ;
		return NULL ;
	}
	memcpy (to_filter, from_filter, sizeof (SINC_FILTER)) ;
	to_filter->buffer = (float *) malloc (sizeof (float) * (from_filter->b_len + state->channels)) ;
	if (!to_filter->buffer)
	{
		free (to) ;
		free (to_filter) ;
		return NULL ;
	}
	memcpy (to_filter->buffer, from_filter->buffer, sizeof (float) * (from_filter->b_len + state->channels)) ;

	to->private_data = to_filter ;

	return to ;
}